

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void UnaryExpression_not_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  undefined1 local_70 [8];
  JsValue r3;
  JsValue r2;
  JsValue r1;
  JsAstUnaryNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  (*JsNodeClassEval[**(uint **)(na + 1)])
            (*(JsAstNode **)(na + 1),context,(JsValue *)((long)&r2.u + 8));
  JsGetValue((JsValue *)((long)&r2.u + 8),(JsValue *)((long)&r3.u + 8));
  JsToBoolean((JsValue *)((long)&r3.u + 8),(JsValue *)local_70);
  res->type = JS_BOOLEAN;
  if (r3.type == JS_NULL) {
    (res->u).boolean = 0;
  }
  else {
    (res->u).boolean = 1;
  }
  return;
}

Assistant:

static void
UnaryExpression_not_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstUnaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstUnaryNode *n = CAST_NODE(na, JsAstUnaryNode);
	struct JsValue r1, r2, r3;

	EVAL(n->a, context, &r1);
	JsGetValue( &r1, &r2);
	JsToBoolean( &r2, &r3);
	res->type = JS_BOOLEAN;
	if(r3.u.boolean == TRUE){
		res->u.boolean  = FALSE;
	}else{
		res->u.boolean  = TRUE;
	}
}